

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O3

void __thiscall CTPNVarInRange::gen_forstm_reinit(CTPNVarInRange *this)

{
  CTcPrsNode *sub;
  CTcPrsNode *right;
  
  sub = (this->super_CTPNVarInRangeBase).lval_;
  right = (this->super_CTPNVarInRangeBase).step_expr_;
  if (right != (CTcPrsNode *)0x0) {
    CTPNAddAsi_gen_code(sub,right,1);
    return;
  }
  CTPNPreInc_gen_code(sub,1);
  return;
}

Assistant:

void CTPNVarInRange::gen_forstm_reinit()
{
    /* 
     *   If we have a step expression, generate "lval += step".  Otherwise
     *   just generate "++lval".  
     */
    if (step_expr_ != 0)
    {
        /* generate "lval += step" */
        CTPNAddAsi_gen_code(lval_, step_expr_, TRUE);
    }
    else
    {
        /* increment the control variable */
        CTPNPreInc_gen_code(lval_, TRUE);
    }
}